

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_test.cpp
# Opt level: O1

bool __thiscall
ReplayInterface::enqueue_create_shader_module
          (ReplayInterface *this,Hash hash,VkShaderModuleCreateInfo *create_info,
          VkShaderModule *module)

{
  bool bVar1;
  bool bVar2;
  Hash in_RAX;
  Hash recorded_hash;
  Hash local_28;
  
  local_28 = in_RAX;
  bVar1 = Fossilize::Hashing::compute_hash_shader_module(create_info,&local_28);
  bVar2 = false;
  if ((bVar1) && (bVar2 = false, local_28 == hash)) {
    *module = (VkShaderModule)hash;
    bVar2 = Fossilize::StateRecorder::record_shader_module
                      (&this->recorder,(VkShaderModule)hash,create_info,0);
  }
  return bVar2;
}

Assistant:

bool enqueue_create_shader_module(Hash hash, const VkShaderModuleCreateInfo *create_info, VkShaderModule *module) override
	{
		Hash recorded_hash;
		if (!Hashing::compute_hash_shader_module(*create_info, &recorded_hash))
			return false;
		if (recorded_hash != hash)
			return false;

		*module = fake_handle<VkShaderModule>(hash);
		return recorder.record_shader_module(*module, *create_info);
	}